

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

int xmlAddEntity(xmlDocPtr doc,int extSubset,xmlChar *name,int type,xmlChar *ExternalID,
                xmlChar *SystemID,xmlChar *content,xmlEntityPtr *out)

{
  byte bVar1;
  _xmlDtd *p_Var2;
  xmlDictPtr dict;
  _xmlNode *p_Var3;
  int iVar4;
  int iVar5;
  xmlEntityPtr pxVar6;
  xmlHashTablePtr hash;
  uint uVar7;
  uint local_38;
  xmlChar local_34;
  char cStack_33;
  undefined2 uStack_32;
  
  if (out != (xmlEntityPtr *)0x0) {
    *out = (xmlEntityPtr)0x0;
  }
  if (name == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) {
    return 0x73;
  }
  p_Var2 = (&doc->intSubset)[extSubset != 0];
  if (p_Var2 == (_xmlDtd *)0x0) {
    return 0x20a;
  }
  dict = doc->dict;
  if (type - 1U < 3) {
    pxVar6 = xmlGetPredefinedEntity(name);
    if (pxVar6 != (xmlEntityPtr)0x0) {
      if (content == (xmlChar *)0x0 || type != 1) {
        return 0x75;
      }
      bVar1 = *pxVar6->content;
      if ((((*content != bVar1) || (content[1] != '\0')) || (0x3e < bVar1)) ||
         ((0x4000008400000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        if (*content != 0x26) {
          return 0x75;
        }
        if (content[1] != '#') {
          return 0x75;
        }
        if (content[2] == 'x') {
          _local_34 = CONCAT22(0x3b,CONCAT11("0123456789ABCDEF"[bVar1 & 0xf],
                                             "0123456789ABCDEF"[bVar1 >> 4]));
          iVar4 = xmlStrcasecmp(content + 3,&local_34);
          if (iVar4 != 0) {
            return 0x75;
          }
        }
        else {
          uVar7 = bVar1 / 10;
          local_38 = CONCAT22(0x3b,CONCAT11(bVar1 + (bVar1 / 5 & 0xfe) * -5,
                                            (char)uVar7 + ((byte)(uVar7 / 5) & 6) * -5) | 0x30) |
                     0x3000;
          iVar4 = xmlStrEqual(content + 2,(xmlChar *)&local_38);
          if (iVar4 == 0) {
            return 0x75;
          }
        }
      }
    }
    hash = (xmlHashTablePtr)p_Var2->entities;
    if (hash != (xmlHashTablePtr)0x0) goto LAB_0012e453;
    hash = xmlHashCreateDict(0,dict);
    p_Var2->entities = hash;
  }
  else {
    if (1 < type - 4U) {
      return 0x73;
    }
    hash = (xmlHashTablePtr)p_Var2->pentities;
    if (hash != (xmlHashTablePtr)0x0) goto LAB_0012e453;
    hash = xmlHashCreateDict(0,dict);
    p_Var2->pentities = hash;
  }
  if (hash == (xmlHashTablePtr)0x0) {
    return 2;
  }
LAB_0012e453:
  pxVar6 = xmlCreateEntity(p_Var2->doc,name,type,ExternalID,SystemID,content);
  iVar4 = 2;
  if (pxVar6 != (xmlEntityPtr)0x0) {
    iVar5 = xmlHashAdd(hash,name,pxVar6);
    if (iVar5 < 0) {
      xmlFreeEntity(pxVar6);
    }
    else if (iVar5 == 0) {
      xmlFreeEntity(pxVar6);
      iVar4 = 0x6b;
    }
    else {
      pxVar6->parent = p_Var2;
      pxVar6->doc = p_Var2->doc;
      p_Var3 = p_Var2->last;
      if (p_Var3 == (_xmlNode *)0x0) {
        p_Var2->children = (_xmlNode *)pxVar6;
      }
      else {
        p_Var3->next = (_xmlNode *)pxVar6;
        pxVar6->prev = p_Var3;
      }
      p_Var2->last = (_xmlNode *)pxVar6;
      iVar4 = 0;
      if (out != (xmlEntityPtr *)0x0) {
        *out = pxVar6;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlAddEntity(xmlDocPtr doc, int extSubset, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content, xmlEntityPtr *out) {
    xmlDtdPtr dtd;
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;
    int res;

    if (out != NULL)
        *out = NULL;
    if ((doc == NULL) || (name == NULL))
	return(XML_ERR_ARGUMENT);
    dict = doc->dict;

    if (extSubset)
        dtd = doc->extSubset;
    else
        dtd = doc->intSubset;
    if (dtd == NULL)
        return(XML_DTD_NO_DTD);

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid)
                    return(XML_ERR_REDECL_PREDEF_ENTITY);
            }
	    if (dtd->entities == NULL) {
		dtd->entities = xmlHashCreateDict(0, dict);
                if (dtd->entities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL) {
		dtd->pentities = xmlHashCreateDict(0, dict);
                if (dtd->pentities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->pentities;
	    break;
        default:
	    return(XML_ERR_ARGUMENT);
    }
    ret = xmlCreateEntity(dtd->doc, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(XML_ERR_NO_MEMORY);

    res = xmlHashAdd(table, name, ret);
    if (res < 0) {
        xmlFreeEntity(ret);
        return(XML_ERR_NO_MEMORY);
    } else if (res == 0) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(XML_WAR_ENTITY_REDEFINED);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
	dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }

    if (out != NULL)
        *out = ret;
    return(0);
}